

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O3

void deqp::gles3::Functional::eval_reflect_vec4(ShaderEvalContext *c)

{
  undefined1 auVar1 [16];
  int i;
  long lVar2;
  float res;
  float fVar3;
  float local_28 [4];
  undefined1 local_18 [8];
  float fStack_10;
  
  auVar1 = *(undefined1 (*) [16])c->in[0].m_data;
  res = auVar1._0_4_;
  unique0x1000000c = res;
  _local_18 = auVar1._4_12_;
  local_28[3] = c->in[1].m_data[0];
  local_28[2] = c->in[1].m_data[1];
  local_28[1] = c->in[1].m_data[2];
  local_28[0] = c->in[1].m_data[3];
  fVar3 = 0.0;
  lVar2 = 0;
  do {
    fVar3 = fVar3 + local_28[lVar2] * *(float *)(local_18 + lVar2 * 4);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  fVar3 = fVar3 + fVar3;
  local_18._0_4_ = auVar1._4_4_;
  local_18._4_4_ = auVar1._8_4_;
  fStack_10 = auVar1._12_4_;
  (c->color).m_data[0] = (float)local_18._0_4_ - fVar3 * local_28[0];
  (c->color).m_data[1] = (float)local_18._4_4_ - fVar3 * local_28[1];
  (c->color).m_data[2] = fStack_10 - fVar3 * local_28[2];
  (c->color).m_data[3] = res - fVar3 * local_28[3];
  return;
}

Assistant:

Vector<T, 4>			swizzle		(int a, int b, int c, int d) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); DE_ASSERT(c >= 0 && c < Size); DE_ASSERT(d >= 0 && d < Size); return Vector<T, 4>(m_data[a], m_data[b], m_data[c], m_data[d]); }